

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O2

void EDLines::SplitSegment2Lines
               (double *x,double *y,int noPixels,int segmentNo,
               vector<LineSegment,_std::allocator<LineSegment>_> *lines,int min_line_len,
               double line_error)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double a;
  double b;
  int lastInvert;
  double local_f8;
  double local_f0;
  int local_e4;
  double local_e0;
  double lastA;
  long local_d0;
  double local_c8;
  double lastB;
  int local_b8;
  uint local_b4;
  ulong local_b0;
  long local_a8;
  vector<LineSegment,_std::allocator<LineSegment>_> *local_a0;
  double ey;
  double sy;
  double sx;
  double error;
  LineSegment local_78;
  
  dVar9 = (double)(ulong)(uint)min_line_len;
  local_e4 = 0;
  local_c8 = line_error;
  local_b8 = segmentNo;
  local_a0 = lines;
  do {
    uVar4 = SUB84(dVar9,0);
    if (noPixels < (int)uVar4) {
      return;
    }
    local_b0 = (ulong)(1 - local_e4);
    local_e4 = -local_e4;
    lVar7 = (long)noPixels;
    while( true ) {
      if ((int)lVar7 < (int)uVar4) {
        return;
      }
      LineFit(x,y,uVar4,&lastA,&lastB,&error,&lastInvert);
      iVar1 = lastInvert;
      dVar10 = dVar9;
      if (error <= 0.5) break;
      x = x + 1;
      y = y + 1;
      local_e4 = local_e4 + -1;
      local_b0 = local_b0 - 1;
      lVar7 = lVar7 + -1;
    }
    do {
      local_b4 = uVar4;
      local_d0 = lVar7;
      local_f8 = dVar10;
      b = lastB;
      a = lastA;
      iVar3 = SUB84(dVar9,0);
      iVar5 = (int)local_d0;
      if (iVar5 <= iVar3) goto LAB_00116036;
      local_e0 = (double)(ulong)(iVar3 - 1);
      iVar5 = 0;
      iVar6 = 0;
      local_f0 = dVar9;
      for (uVar8 = (ulong)iVar3; (long)uVar8 < local_d0; uVar8 = uVar8 + 1) {
        dVar9 = ComputeMinDistance(x[uVar8],y[uVar8],a,b,iVar1);
        if (dVar9 <= local_c8) {
          iVar5 = iVar5 + 1;
          iVar6 = 0;
          local_e0 = (double)(uVar8 & 0xffffffff);
        }
        else {
          if (3 < iVar6) break;
          iVar6 = iVar6 + 1;
        }
      }
      iVar3 = SUB84(local_e0,0);
      if (iVar5 < 2) break;
      uVar4 = (SUB84(local_f8,0) - local_f0._0_4_) + iVar3 + 1;
      local_f8 = (double)(ulong)uVar4;
      LineFit(x,y,uVar4,&lastA,&lastB,iVar1);
      dVar9 = (double)(ulong)(iVar3 + 1U);
      a = lastA;
      b = lastB;
      dVar10 = local_f8;
      lVar7 = local_d0;
      uVar4 = local_b4;
    } while ((int)(iVar3 + 1U) < (int)local_d0);
    lVar7 = 0;
    do {
      lVar2 = lVar7;
      local_f8 = x[lVar2];
      local_f0 = y[lVar2];
      dVar9 = ComputeMinDistance(local_f8,local_f0,a,b,iVar1);
      lVar7 = lVar2 + 1;
    } while (local_c8 < dVar9);
    local_a8 = lVar2 + 1;
    ComputeClosestPoint(local_f8,local_f0,a,b,iVar1,&sx,&sy);
    lVar7 = (long)iVar3;
    dVar9 = (double)(ulong)(iVar3 + 2U);
    iVar5 = (iVar3 + 2U) - (int)lVar2;
    do {
      local_e0 = x[lVar7];
      local_f0 = y[lVar7];
      dVar10 = ComputeMinDistance(local_e0,local_f0,a,b,iVar1);
      lVar7 = lVar7 + -1;
      iVar5 = iVar5 + -1;
      dVar9 = (double)(ulong)(SUB84(dVar9,0) - 1);
    } while (local_c8 < dVar10);
    local_f8 = dVar9;
    ComputeClosestPoint(local_e0,local_f0,a,b,iVar1,&local_78.ex,&ey);
    local_78.firstPixelIndex = (int)local_a8 - (int)local_b0;
    local_78.invert = iVar1;
    local_78.sx = sx;
    local_78.sy = sy;
    local_78.ey = ey;
    local_78.segmentNo = local_b8;
    local_78.len = iVar5;
    std::vector<LineSegment,_std::allocator<LineSegment>_>::emplace_back<LineSegment>
              (local_a0,&local_78);
    iVar5 = (int)local_d0;
LAB_00116036:
    iVar1 = SUB84(local_f8,0);
    noPixels = iVar5 - iVar1;
    x = x + iVar1;
    y = y + iVar1;
    local_e4 = iVar1 - local_e4;
    dVar9 = (double)(ulong)local_b4;
  } while( true );
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo, vector<LineSegment> &lines, int min_line_len, double line_error)
{
	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				//linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}